

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateShutdownCode
          (MessageGenerator *this,Printer *printer)

{
  Printer *this_00;
  bool bVar1;
  int iVar2;
  FileDescriptor *file;
  FieldDescriptor *field;
  FieldGenerator *pFVar3;
  int i_00;
  int local_48;
  int i;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  bVar1 = IsMapEntryMessage(this->descriptor_);
  if (!bVar1) {
    io::Printer::Print(local_18,"_$classname$_default_instance_.Shutdown();\n","classname",
                       &this->classname_);
    file = Descriptor::file(this->descriptor_);
    bVar1 = HasDescriptorMethods(file,&this->options_);
    this_00 = local_18;
    if (bVar1) {
      SimpleItoa_abi_cxx11_(&local_38,(protobuf *)(ulong)(uint)this->index_in_file_messages_,i_00);
      io::Printer::Print(this_00,"delete file_level_metadata[$index$].reflection;\n","index",
                         &local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    for (local_48 = 0; iVar2 = Descriptor::field_count(this->descriptor_), local_48 < iVar2;
        local_48 = local_48 + 1) {
      field = Descriptor::field(this->descriptor_,local_48);
      pFVar3 = FieldGeneratorMap::get(&this->field_generators_,field);
      (*pFVar3->_vptr_FieldGenerator[0x12])(pFVar3,local_18);
    }
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateShutdownCode(io::Printer* printer) {
  if (IsMapEntryMessage(descriptor_)) return;

  printer->Print("_$classname$_default_instance_.Shutdown();\n", "classname",
                 classname_);

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    printer->Print("delete file_level_metadata[$index$].reflection;\n", "index",
                   SimpleItoa(index_in_file_messages_));
  }

  // Handle default instances of fields.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateShutdownCode(printer);
  }
}